

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.hpp
# Opt level: O0

ArrayMapEntry<unsigned_int> *
array_new<Lib::ArrayMapEntry<unsigned_int>>(void *placement,size_t length)

{
  long in_RSI;
  ArrayMapEntry<unsigned_int> *in_RDI;
  ArrayMapEntry<unsigned_int> *p;
  ArrayMapEntry<unsigned_int> *res;
  ArrayMapEntry<unsigned_int> *local_20;
  long local_10;
  
  local_20 = in_RDI;
  local_10 = in_RSI;
  while (local_10 != 0) {
    Lib::ArrayMapEntry<unsigned_int>::ArrayMapEntry(local_20);
    local_20 = local_20 + 1;
    local_10 = local_10 + -1;
  }
  return in_RDI;
}

Assistant:

T* array_new(void* placement, size_t length)
{
  ASS_NEQ(placement,0);
  ASS_G(length,0);

  T* res=static_cast<T*>(placement);
  T* p=res;
  while(length--) {
    ::new(static_cast<void*>(p++)) T();
  }
  return res;
}